

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.h
# Opt level: O0

void __thiscall Dyndeps::~Dyndeps(Dyndeps *this)

{
  Dyndeps *this_local;
  
  std::vector<Node_*,_std::allocator<Node_*>_>::~vector(&this->implicit_outputs_);
  std::vector<Node_*,_std::allocator<Node_*>_>::~vector(&this->implicit_inputs_);
  return;
}

Assistant:

Dyndeps() : used_(false), restat_(false) {}